

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O2

void __thiscall
yactfr::internal::JsonIntTypeMappingsFlagsValReq<yactfr::internal::JsonSIntValReq>::
JsonIntTypeMappingsFlagsValReq
          (JsonIntTypeMappingsFlagsValReq<yactfr::internal::JsonSIntValReq> *this,char *propName,
          char *objName,bool allowEmpty)

{
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_58;
  
  local_58._M_buckets = &local_58._M_single_bucket;
  local_58._M_bucket_count = 1;
  local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58._M_element_count = 0;
  local_58._M_rehash_policy._M_max_load_factor = 1.0;
  local_58._M_rehash_policy._4_4_ = 0;
  local_58._M_rehash_policy._M_next_resize = 0;
  local_58._M_single_bucket = (__node_base_ptr)0x0;
  JsonObjValReq::JsonObjValReq(&this->super_JsonObjValReq,(PropReqs *)&local_58,true);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_58);
  (this->super_JsonObjValReq).super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonIntTypeMappingsFlagsValReq_00360148;
  JsonIntRangeSetValReqBase<yactfr::internal::JsonSIntValReq>::JsonIntRangeSetValReqBase
            (&this->_rangeSetReq);
  this->_propName = propName;
  this->_objName = objName;
  this->_allowEmpty = allowEmpty;
  return;
}

Assistant:

explicit JsonIntTypeMappingsFlagsValReq(const char * const propName,
                                            const char * const objName,
                                            const bool allowEmpty = true) :
        JsonObjValReq {{}, true},
        _propName {propName},
        _objName {objName},
        _allowEmpty {allowEmpty}
    {
    }